

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void V_SetBlend(int blendr,int blendg,int blendb,int blenda)

{
  int blenda_local;
  int blendb_local;
  int blendg_local;
  int blendr_local;
  
  if ((blenda != 0 || BlendA != 0) &&
     ((((blendr != BlendR || (blendg != BlendG)) || (blendb != BlendB)) || (blenda != BlendA)))) {
    V_ForceBlend(blendr,blendg,blendb,blenda);
  }
  return;
}

Assistant:

void V_SetBlend (int blendr, int blendg, int blendb, int blenda)
{
	// Don't do anything if the new blend is the same as the old
	if (((blenda|BlendA) == 0) ||
		(blendr == BlendR &&
		 blendg == BlendG &&
		 blendb == BlendB &&
		 blenda == BlendA))
		return;

	V_ForceBlend (blendr, blendg, blendb, blenda);
}